

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.cpp
# Opt level: O2

void trt_pose::parse::subMinRow(float *cost_graph,int M,int nrows,int ncols)

{
  float fVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  float *pfVar5;
  int j;
  ulong uVar6;
  float fVar7;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)ncols;
  if (ncols < 1) {
    uVar3 = uVar2;
  }
  pfVar5 = cost_graph;
  uVar4 = (ulong)(uint)nrows;
  if (nrows < 1) {
    uVar4 = uVar2;
  }
  for (; uVar2 != uVar4; uVar2 = uVar2 + 1) {
    fVar7 = cost_graph[uVar2 * (long)M];
    for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
      fVar1 = pfVar5[uVar6];
      if (fVar7 <= pfVar5[uVar6]) {
        fVar1 = fVar7;
      }
      fVar7 = fVar1;
    }
    for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
      pfVar5[uVar6] = pfVar5[uVar6] - fVar7;
    }
    pfVar5 = pfVar5 + M;
  }
  return;
}

Assistant:

void subMinRow(float *cost_graph, const int M, const int nrows,
               const int ncols) {
  for (int i = 0; i < nrows; i++) {
    // find min
    float min = cost_graph[i * M];
    for (int j = 0; j < ncols; j++) {
      float val = cost_graph[i * M + j];
      if (val < min) {
        min = val;
      }
    }

    // subtract min
    for (int j = 0; j < ncols; j++) {
      cost_graph[i * M + j] -= min;
    }
  }
}